

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O1

AssertionExpr *
slang::ast::UnaryAssertionExpr::fromSyntax
          (UnarySelectPropertyExprSyntax *syntax,ASTContext *context)

{
  Scope *pSVar1;
  Compilation *this;
  AssertionExpr *this_00;
  int iVar2;
  undefined4 extraout_var;
  UnaryAssertionExpr *pUVar3;
  char *func;
  bitmask<slang::ast::ASTFlags> addedFlags;
  SequenceRange SVar4;
  UnaryAssertionOperator op;
  UnaryAssertionOperator local_6c;
  _Storage<slang::ast::SequenceRange,_true> local_68;
  char local_5c;
  ASTContext local_58;
  
  pSVar1 = (context->scope).ptr;
  if (pSVar1 == (Scope *)0x0) {
    func = 
    "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]";
  }
  else {
    this = pSVar1->compilation;
    local_6c = getUnaryOp((syntax->op).kind);
    local_5c = '\0';
    if (syntax->selector != (SelectorSyntax *)0x0) {
      SVar4 = SequenceRange::fromSyntax
                        (syntax->selector,context,local_6c == SEventually || local_6c == Always);
      local_68._0_8_ = SVar4._0_8_;
      local_68._M_value.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_engaged =
           (bool)SVar4.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_int>._M_engaged;
      if (local_5c == '\0') {
        local_5c = '\x01';
      }
    }
    if ((((Eventually < local_6c) || ((0x2aU >> (local_6c & 0x1f) & 1) == 0)) ||
        (local_5c != '\x01')) || (addedFlags.m_bits = 0x1000000, local_68._M_value.min == 0)) {
      addedFlags.m_bits = (ulong)((local_6c & ~SEventually) == Not) << 0x17;
    }
    this_00 = (AssertionExpr *)(syntax->expr).ptr;
    if (this_00 != (AssertionExpr *)0x0) {
      ASTContext::resetFlags(&local_58,context,addedFlags);
      iVar2 = AssertionExpr::bind(this_00,(int)&local_58,(sockaddr *)0x0,0);
      pUVar3 = BumpAllocator::
               emplace<slang::ast::UnaryAssertionExpr,slang::ast::UnaryAssertionOperator&,slang::ast::AssertionExpr_const&,std::optional<slang::ast::SequenceRange>&>
                         (&this->super_BumpAllocator,&local_6c,
                          (AssertionExpr *)CONCAT44(extraout_var,iVar2),
                          (optional<slang::ast::SequenceRange> *)&local_68._M_value);
      return &pUVar3->super_AssertionExpr;
    }
    func = 
    "T slang::not_null<slang::syntax::PropertyExprSyntax *>::get() const [T = slang::syntax::PropertyExprSyntax *]"
    ;
  }
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,func);
}

Assistant:

bool visitInvalid(const AssertionExpr&) { return false; }